

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractNumericFacetValidator.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::AbstractNumericFacetValidator::assignFacet
          (AbstractNumericFacetValidator *this,MemoryManager *manager)

{
  int *piVar1;
  byte *pbVar2;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *toEnum;
  XMLCh *str1;
  XMLCh *toConvert;
  bool bVar3;
  KVStringPair *toCopy;
  InvalidDatatypeFacetException *this_00;
  uint val;
  RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> e;
  KVStringPair pair;
  
  toEnum = (this->super_DatatypeValidator).fFacets;
  if (toEnum != (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) {
    RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
    RefHashTableOfEnumerator(&e,toEnum,false,manager);
    while ((e.fCurElem != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0 ||
           (e.fCurHash != (e.fToEnum)->fHashModulus))) {
      toCopy = RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
               nextElement(&e);
      KVStringPair::KVStringPair(&pair,toCopy);
      toConvert = pair.fValue;
      str1 = pair.fKey;
      bVar3 = XMLString::equals(pair.fKey,(XMLCh *)SchemaSymbols::fgELT_PATTERN);
      if (bVar3) {
        DatatypeValidator::setPattern(&this->super_DatatypeValidator,toConvert);
        if ((this->super_DatatypeValidator).fPattern != (XMLCh *)0x0) {
          piVar1 = &(this->super_DatatypeValidator).fFacetsDefined;
          *(byte *)piVar1 = (byte)*piVar1 | 8;
        }
      }
      else {
        bVar3 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgELT_MAXINCLUSIVE);
        if (bVar3) {
          (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x12])
                    (this,toConvert);
          piVar1 = &(this->super_DatatypeValidator).fFacetsDefined;
          *(byte *)piVar1 = (byte)*piVar1 | 0x20;
        }
        else {
          bVar3 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgELT_MAXEXCLUSIVE);
          if (bVar3) {
            (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x13])
                      (this,toConvert);
            piVar1 = &(this->super_DatatypeValidator).fFacetsDefined;
            *(byte *)piVar1 = (byte)*piVar1 | 0x40;
          }
          else {
            bVar3 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgELT_MININCLUSIVE);
            if (bVar3) {
              (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x14])
                        (this,toConvert);
              piVar1 = &(this->super_DatatypeValidator).fFacetsDefined;
              *(byte *)piVar1 = (byte)*piVar1 | 0x80;
            }
            else {
              bVar3 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgELT_MINEXCLUSIVE);
              if (bVar3) {
                (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x15])
                          (this,toConvert);
                pbVar2 = (byte *)((long)&(this->super_DatatypeValidator).fFacetsDefined + 1);
                *pbVar2 = *pbVar2 | 1;
              }
              else {
                bVar3 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgATT_FIXED);
                if (bVar3) {
                  bVar3 = XMLString::textToBin
                                    (toConvert,&val,(this->super_DatatypeValidator).fMemoryManager);
                  if (!bVar3) {
                    this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
                    InvalidDatatypeFacetException::InvalidDatatypeFacetException
                              (this_00,
                               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                               ,0xe3,FACET_internalError_fixed,manager);
                    __cxa_throw(this_00,&InvalidDatatypeFacetException::typeinfo,
                                XMLException::~XMLException);
                  }
                  piVar1 = &(this->super_DatatypeValidator).fFixed;
                  *piVar1 = *piVar1 | val;
                }
                else {
                  (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0xc])
                            (this,str1,toConvert,manager);
                }
              }
            }
          }
        }
      }
      KVStringPair::~KVStringPair(&pair);
    }
    RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
    ~RefHashTableOfEnumerator(&e);
  }
  return;
}

Assistant:

void AbstractNumericFacetValidator::assignFacet(MemoryManager* const manager)
{

    RefHashTableOf<KVStringPair>* facets = getFacets();

    if (!facets)     // no facets defined
        return;

    XMLCh* key;

    RefHashTableOfEnumerator<KVStringPair> e(facets, false, manager);

    while (e.hasMoreElements())
    {
        KVStringPair pair = e.nextElement();
        key = pair.getKey();
        XMLCh* value = pair.getValue();

        if (XMLString::equals(key, SchemaSymbols::fgELT_PATTERN))
        {
            setPattern(value);
            if (getPattern())
                setFacetsDefined(DatatypeValidator::FACET_PATTERN);
            // do not construct regex until needed
        }
        else if (XMLString::equals(key, SchemaSymbols::fgELT_MAXINCLUSIVE))
        {
            try
            {
                setMaxInclusive(value);
            }
            catch (NumberFormatException&)
            {
                ThrowXMLwithMemMgr1(InvalidDatatypeFacetException, XMLExcepts::FACET_Invalid_MaxIncl, value, manager);
            }
            setFacetsDefined(DatatypeValidator::FACET_MAXINCLUSIVE);
        }
        else if (XMLString::equals(key, SchemaSymbols::fgELT_MAXEXCLUSIVE))
        {
            try
            {
                setMaxExclusive(value);
            }
            catch (NumberFormatException&)
            {
                ThrowXMLwithMemMgr1(InvalidDatatypeFacetException, XMLExcepts::FACET_Invalid_MaxExcl, value, manager);
            }
            setFacetsDefined(DatatypeValidator::FACET_MAXEXCLUSIVE);
        }
        else if (XMLString::equals(key, SchemaSymbols::fgELT_MININCLUSIVE))
        {
            try
            {
                setMinInclusive(value);
            }
            catch (NumberFormatException&)
            {
                ThrowXMLwithMemMgr1(InvalidDatatypeFacetException, XMLExcepts::FACET_Invalid_MinIncl, value, manager);
            }
            setFacetsDefined(DatatypeValidator::FACET_MININCLUSIVE);
        }
        else if (XMLString::equals(key, SchemaSymbols::fgELT_MINEXCLUSIVE))
        {
            try
            {
                setMinExclusive(value);
            }
            catch (NumberFormatException&)
            {
                ThrowXMLwithMemMgr1(InvalidDatatypeFacetException, XMLExcepts::FACET_Invalid_MinExcl, value, manager);
            }
            setFacetsDefined(DatatypeValidator::FACET_MINEXCLUSIVE);
        }
        else if (XMLString::equals(key, SchemaSymbols::fgATT_FIXED))
        {
            unsigned int val;
            bool         retStatus;
            try
            {
                retStatus = XMLString::textToBin(value, val, fMemoryManager);
            }
            catch (RuntimeException&)
            {
                ThrowXMLwithMemMgr(InvalidDatatypeFacetException, XMLExcepts::FACET_internalError_fixed, manager);
            }

            if (!retStatus)
            {
                ThrowXMLwithMemMgr(InvalidDatatypeFacetException, XMLExcepts::FACET_internalError_fixed, manager);
            }

            setFixed(val);
            //no setFacetsDefined here

        }
        else
        {
            assignAdditionalFacet(key, value, manager);
        }

    }//while

}